

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::EmitSnapContext(SnapContext *snapCtx,FileWriter *writer,Separator separator)

{
  TopLevelFunctionInContextRelation *pTVar1;
  uint local_50;
  Separator sep_3;
  uint32 i_3;
  Separator sep_2;
  TopLevelFunctionInContextRelation *cri_2;
  uint32 i_2;
  Separator sep_1;
  TopLevelFunctionInContextRelation *cri_1;
  uint32 i_1;
  Separator sep;
  TopLevelFunctionInContextRelation *cri;
  uint32 i;
  Separator separator_local;
  FileWriter *writer_local;
  SnapContext *snapCtx_local;
  
  (*writer->_vptr_FileWriter[6])(writer,(ulong)separator);
  FileWriter::WriteLogTag(writer,ctxTag,snapCtx->ScriptContextLogId,NoSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(snapCtx->IsPNRGSeeded & 1),1);
  FileWriter::WriteUInt64(writer,u64Val,snapCtx->RandomSeed0,CommaSeparator);
  FileWriter::WriteUInt64(writer,u64Val,snapCtx->RandomSeed1,CommaSeparator);
  FileWriter::WriteString(writer,ctxUri,&snapCtx->ContextSRC,CommaSeparator);
  FileWriter::WriteLengthValue(writer,snapCtx->LoadedTopLevelScriptCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  for (cri._0_4_ = 0; (uint)cri < snapCtx->LoadedTopLevelScriptCount; cri._0_4_ = (uint)cri + 1) {
    pTVar1 = snapCtx->LoadedTopLevelScriptArray;
    (*writer->_vptr_FileWriter[6])(writer,(ulong)((uint)cri != 0));
    FileWriter::WriteUInt32(writer,bodyCounterId,pTVar1[(uint)cri].TopLevelBodyCtr,NoSeparator);
    FileWriter::WriteAddr
              (writer,functionBodyId,pTVar1[(uint)cri].ContextSpecificBodyPtrId,CommaSeparator);
    (*writer->_vptr_FileWriter[7])();
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  FileWriter::WriteLengthValue(writer,snapCtx->NewFunctionTopLevelScriptCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  for (cri_1._0_4_ = 0; (uint)cri_1 < snapCtx->NewFunctionTopLevelScriptCount;
      cri_1._0_4_ = (uint)cri_1 + 1) {
    pTVar1 = snapCtx->NewFunctionTopLevelScriptArray;
    (*writer->_vptr_FileWriter[6])(writer,(ulong)((uint)cri_1 != 0));
    FileWriter::WriteUInt32(writer,bodyCounterId,pTVar1[(uint)cri_1].TopLevelBodyCtr,NoSeparator);
    FileWriter::WriteAddr
              (writer,functionBodyId,pTVar1[(uint)cri_1].ContextSpecificBodyPtrId,CommaSeparator);
    (*writer->_vptr_FileWriter[7])();
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  FileWriter::WriteLengthValue(writer,snapCtx->EvalTopLevelScriptCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  for (cri_2._0_4_ = 0; (uint)cri_2 < snapCtx->EvalTopLevelScriptCount;
      cri_2._0_4_ = (uint)cri_2 + 1) {
    pTVar1 = snapCtx->EvalTopLevelScriptArray;
    (*writer->_vptr_FileWriter[6])(writer,(ulong)((uint)cri_2 != 0));
    FileWriter::WriteUInt32(writer,bodyCounterId,pTVar1[(uint)cri_2].TopLevelBodyCtr,NoSeparator);
    FileWriter::WriteAddr
              (writer,functionBodyId,pTVar1[(uint)cri_2].ContextSpecificBodyPtrId,CommaSeparator);
    (*writer->_vptr_FileWriter[7])();
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  FileWriter::WriteLengthValue(writer,snapCtx->PendingAsyncModCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  for (local_50 = 0; local_50 < snapCtx->PendingAsyncModCount; local_50 = local_50 + 1) {
    (*writer->_vptr_FileWriter[6])
              (writer,(ulong)(local_50 != 0),0,(ulong)CONCAT31((int3)(local_50 >> 8),local_50 != 0))
    ;
    FileWriter::WriteLogTag(writer,logTag,snapCtx->PendingAsyncModArray[local_50].LogId,NoSeparator)
    ;
    FileWriter::WriteUInt32
              (writer,u32Val,snapCtx->PendingAsyncModArray[local_50].Index,CommaSeparator);
    (*writer->_vptr_FileWriter[7])();
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitSnapContext(const SnapContext* snapCtx, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);

            writer->WriteLogTag(NSTokens::Key::ctxTag, snapCtx->ScriptContextLogId);
            writer->WriteBool(NSTokens::Key::boolVal, snapCtx->IsPNRGSeeded, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt64(NSTokens::Key::u64Val, snapCtx->RandomSeed0, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt64(NSTokens::Key::u64Val, snapCtx->RandomSeed1, NSTokens::Separator::CommaSeparator);
            writer->WriteString(NSTokens::Key::ctxUri, snapCtx->ContextSRC, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(snapCtx->LoadedTopLevelScriptCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < snapCtx->LoadedTopLevelScriptCount; ++i)
            {
                const TopLevelFunctionInContextRelation* cri = snapCtx->LoadedTopLevelScriptArray + i;
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;

                writer->WriteRecordStart(sep);
                writer->WriteUInt32(NSTokens::Key::bodyCounterId, cri->TopLevelBodyCtr);
                writer->WriteAddr(NSTokens::Key::functionBodyId, cri->ContextSpecificBodyPtrId, NSTokens::Separator::CommaSeparator);
                writer->WriteRecordEnd();
            }
            writer->WriteSequenceEnd();

            writer->WriteLengthValue(snapCtx->NewFunctionTopLevelScriptCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < snapCtx->NewFunctionTopLevelScriptCount; ++i)
            {
                const TopLevelFunctionInContextRelation* cri = snapCtx->NewFunctionTopLevelScriptArray + i;
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;

                writer->WriteRecordStart(sep);
                writer->WriteUInt32(NSTokens::Key::bodyCounterId, cri->TopLevelBodyCtr);
                writer->WriteAddr(NSTokens::Key::functionBodyId, cri->ContextSpecificBodyPtrId, NSTokens::Separator::CommaSeparator);
                writer->WriteRecordEnd();
            }
            writer->WriteSequenceEnd();

            writer->WriteLengthValue(snapCtx->EvalTopLevelScriptCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < snapCtx->EvalTopLevelScriptCount; ++i)
            {
                const TopLevelFunctionInContextRelation* cri = snapCtx->EvalTopLevelScriptArray + i;
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;

                writer->WriteRecordStart(sep);
                writer->WriteUInt32(NSTokens::Key::bodyCounterId, cri->TopLevelBodyCtr);
                writer->WriteAddr(NSTokens::Key::functionBodyId, cri->ContextSpecificBodyPtrId, NSTokens::Separator::CommaSeparator);
                writer->WriteRecordEnd();
            }
            writer->WriteSequenceEnd();

            writer->WriteLengthValue(snapCtx->PendingAsyncModCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < snapCtx->PendingAsyncModCount; ++i)
            {
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;
                writer->WriteRecordStart(sep);
                writer->WriteLogTag(NSTokens::Key::logTag, snapCtx->PendingAsyncModArray[i].LogId);
                writer->WriteUInt32(NSTokens::Key::u32Val, snapCtx->PendingAsyncModArray[i].Index, NSTokens::Separator::CommaSeparator);
                writer->WriteRecordEnd();
            }
            writer->WriteSequenceEnd();

            writer->WriteRecordEnd();
        }